

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::
     format<std::__cxx11::string,std::__cxx11::string,long,int,std::__cxx11::string,std::__cxx11::string,long,int>
               (ostream *out,char *fmt,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
               long *args_2,int *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
               long *args_6,int *args_7)

{
  long in_FS_OFFSET;
  FormatArg local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  code *local_c8;
  code *local_c0;
  long *local_b8;
  code *local_b0;
  code *local_a8;
  int *local_a0;
  code *local_98;
  code *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  code *local_80;
  code *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  code *local_68;
  code *local_60;
  long *local_58;
  code *local_50;
  code *local_48;
  int *local_40;
  code *local_38;
  code *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_e8.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_c8 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_c0 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_b0 = detail::FormatArg::formatImpl<long>;
  local_a8 = detail::FormatArg::toIntImpl<long>;
  local_98 = detail::FormatArg::formatImpl<int>;
  local_90 = detail::FormatArg::toIntImpl<int>;
  local_88 = args_4;
  local_80 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_78 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_70 = args_5;
  local_68 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_60 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_58 = args_6;
  local_50 = detail::FormatArg::formatImpl<long>;
  local_48 = detail::FormatArg::toIntImpl<long>;
  local_40 = args_7;
  local_38 = detail::FormatArg::formatImpl<int>;
  local_30 = detail::FormatArg::toIntImpl<int>;
  local_e8.m_value = args;
  local_d0 = args_1;
  local_b8 = args_2;
  local_a0 = args_3;
  detail::formatImpl(out,fmt,&local_e8,8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}